

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O1

e_int16 OPLL_calc(OPLL *opll)

{
  e_int16 eVar1;
  short sVar2;
  uint uVar3;
  
  if (opll->quality == 0) {
    eVar1 = calc(opll);
    return eVar1;
  }
  while( true ) {
    uVar3 = opll->oplltime;
    if (opll->realstep <= uVar3) break;
    opll->oplltime = uVar3 + opll->opllstep;
    opll->prev = opll->next;
    eVar1 = calc(opll);
    opll->next = (int)eVar1;
  }
  uVar3 = uVar3 - opll->realstep;
  opll->oplltime = uVar3;
  sVar2 = (short)(int)(((double)uVar3 * (double)opll->prev +
                       (double)(opll->opllstep - uVar3) * (double)opll->next) /
                      (double)opll->opllstep);
  opll->out = (int)sVar2;
  return sVar2;
}

Assistant:

e_int16
OPLL_calc (OPLL * opll)
{
  if (!opll->quality)
    return calc (opll);

  while (opll->realstep > opll->oplltime)
  {
    opll->oplltime += opll->opllstep;
    opll->prev = opll->next;
    opll->next = calc (opll);
  }

  opll->oplltime -= opll->realstep;
  opll->out = (e_int16) (((double) opll->next * (opll->opllstep - opll->oplltime)
                          + (double) opll->prev * opll->oplltime) / opll->opllstep);

  return (e_int16) opll->out;
}